

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector_senswrapper.c
# Opt level: O1

N_Vector N_VClone_SensWrapper(N_Vector w)

{
  void *pvVar1;
  N_Vector v;
  N_Vector p_Var2;
  long lVar3;
  
  v = N_VCloneEmpty_SensWrapper(w);
  if (v == (N_Vector)0x0) {
LAB_00109f21:
    v = (N_Vector)0x0;
  }
  else {
    pvVar1 = v->content;
    *(undefined4 *)((long)pvVar1 + 0xc) = 1;
    if (0 < *(int *)((long)pvVar1 + 8)) {
      lVar3 = 0;
      do {
        p_Var2 = N_VClone(*(N_Vector *)(*w->content + lVar3 * 8));
        *(N_Vector *)(*v->content + lVar3 * 8) = p_Var2;
        if (*(long *)(*v->content + lVar3 * 8) == 0) {
          N_VDestroy(v);
          goto LAB_00109f21;
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 < *(int *)((long)v->content + 8));
    }
  }
  return v;
}

Assistant:

N_Vector N_VClone_SensWrapper(N_Vector w)
{
  N_Vector v;
  int i;

  /* create empty wrapper */
  v = NULL;
  v = N_VCloneEmpty_SensWrapper(w);
  if (v == NULL) { return (NULL); }

  /* update own vectors status */
  NV_OWN_VECS_SW(v) = SUNTRUE;

  /* allocate arrays */
  for (i = 0; i < NV_NVECS_SW(v); i++)
  {
    NV_VEC_SW(v, i) = N_VClone(NV_VEC_SW(w, i));
    if (NV_VEC_SW(v, i) == NULL)
    {
      N_VDestroy(v);
      return (NULL);
    }
  }

  return (v);
}